

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureBufferActiveUniformValidation.cpp
# Opt level: O1

void __thiscall
glcts::TextureBufferActiveUniformValidationVSFS::configureProgram
          (TextureBufferActiveUniformValidationVSFS *this,
          vector<glcts::TextureParameters,_std::allocator<glcts::TextureParameters>_> *params,
          GLuint *texIds)

{
  GLuint GVar1;
  code *pcVar2;
  pointer pcVar3;
  int iVar4;
  int iVar5;
  deUint32 dVar6;
  undefined4 extraout_var;
  pointer pTVar8;
  TestError *this_00;
  ulong uVar9;
  ulong uVar10;
  long *local_50 [2];
  long local_40 [2];
  long lVar7;
  
  iVar4 = (*((this->super_TextureBufferActiveUniformValidation).super_TestCaseBase.m_context)->
            m_renderCtx->_vptr_RenderContext[3])();
  lVar7 = CONCAT44(extraout_var,iVar4);
  pTVar8 = (params->
           super__Vector_base<glcts::TextureParameters,_std::allocator<glcts::TextureParameters>_>).
           _M_impl.super__Vector_impl_data._M_start;
  if ((params->
      super__Vector_base<glcts::TextureParameters,_std::allocator<glcts::TextureParameters>_>).
      _M_impl.super__Vector_impl_data._M_finish != pTVar8) {
    iVar4 = 0x84c0;
    uVar10 = 0;
    do {
      pcVar2 = *(code **)(lVar7 + 0xb48);
      GVar1 = (this->super_TextureBufferActiveUniformValidation).m_po_id;
      pcVar3 = pTVar8[uVar10].m_uniform_name._M_dataplus._M_p;
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_50,pcVar3,pcVar3 + pTVar8[uVar10].m_uniform_name._M_string_length);
      iVar5 = (*pcVar2)(GVar1,local_50[0]);
      if (local_50[0] != local_40) {
        operator_delete(local_50[0],local_40[0] + 1);
      }
      dVar6 = (**(code **)(lVar7 + 0x800))();
      glu::checkError(dVar6,"Error getting uniform location!",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferActiveUniformValidation.cpp"
                      ,0x22f);
      if (iVar5 == -1) {
        this_00 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (this_00,"Could not get uniform location for active uniform variable",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferActiveUniformValidation.cpp"
                   ,0x232);
        __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
      }
      (**(code **)(lVar7 + 8))(iVar4);
      dVar6 = (**(code **)(lVar7 + 0x800))();
      glu::checkError(dVar6,"Error activating texture unit!",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferActiveUniformValidation.cpp"
                      ,0x236);
      (**(code **)(lVar7 + 0xb8))
                ((this->super_TextureBufferActiveUniformValidation).super_TestCaseBase.m_glExtTokens
                 .TEXTURE_BUFFER,texIds[uVar10]);
      dVar6 = (**(code **)(lVar7 + 0x800))();
      glu::checkError(dVar6,"Error binding texture object!",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferActiveUniformValidation.cpp"
                      ,0x238);
      (**(code **)(lVar7 + 0x14f0))(iVar5,iVar4 + -0x84c0);
      dVar6 = (**(code **)(lVar7 + 0x800))();
      glu::checkError(dVar6,"Error setting value for uniform location!",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferActiveUniformValidation.cpp"
                      ,0x23a);
      uVar10 = (ulong)(iVar4 - 0x84bf);
      pTVar8 = (params->
               super__Vector_base<glcts::TextureParameters,_std::allocator<glcts::TextureParameters>_>
               )._M_impl.super__Vector_impl_data._M_start;
      uVar9 = ((long)(params->
                     super__Vector_base<glcts::TextureParameters,_std::allocator<glcts::TextureParameters>_>
                     )._M_impl.super__Vector_impl_data._M_finish - (long)pTVar8 >> 4) *
              -0x5555555555555555;
      iVar4 = iVar4 + 1;
    } while (uVar10 <= uVar9 && uVar9 - uVar10 != 0);
  }
  return;
}

Assistant:

void TextureBufferActiveUniformValidationVSFS::configureProgram(std::vector<TextureParameters>* params,
																glw::GLuint*					texIds)
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	for (glw::GLuint i = 0; i < params->size(); ++i)
	{
		glw::GLint location = gl.getUniformLocation(m_po_id, (*params)[i].get_uniform_name().c_str());
		GLU_EXPECT_NO_ERROR(gl.getError(), "Error getting uniform location!");
		if (location == -1)
		{
			TCU_FAIL("Could not get uniform location for active uniform variable");
		}

		gl.activeTexture(GL_TEXTURE0 + i);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Error activating texture unit!");
		gl.bindTexture(m_glExtTokens.TEXTURE_BUFFER, texIds[i]);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Error binding texture object!");
		gl.uniform1i(location, i);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Error setting value for uniform location!");
	}
}